

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::ForkBranchBase::~ForkBranchBase(ForkBranchBase *this)

{
  ForkHubBase *pFVar1;
  Disposer *pDVar2;
  ForkBranchBase ***pppFVar3;
  
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_004658d0;
  if (this->prevPtr != (ForkBranchBase **)0x0) {
    *this->prevPtr = this->next;
    pppFVar3 = &this->next->prevPtr;
    if (this->next == (ForkBranchBase *)0x0) {
      pppFVar3 = &((this->hub).ptr)->tailBranch;
    }
    *pppFVar3 = this->prevPtr;
  }
  pFVar1 = (this->hub).ptr;
  if (pFVar1 != (ForkHubBase *)0x0) {
    (this->hub).ptr = (ForkHubBase *)0x0;
    pDVar2 = (this->hub).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pFVar1->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                      (long)&(pFVar1->super_Refcounted).super_Disposer._vptr_Disposer);
    return;
  }
  return;
}

Assistant:

ForkBranchBase::~ForkBranchBase() noexcept(false) {
  if (prevPtr != nullptr) {
    // Remove from hub's linked list of branches.
    *prevPtr = next;
    (next == nullptr ? hub->tailBranch : next->prevPtr) = prevPtr;
  }
}